

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFIn.cpp
# Opt level: O2

bool __thiscall NaPNFileInput::activate(NaPNFileInput *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  
  bVar1 = NaPetriNode::activate(&this->super_NaPetriNode);
  if (bVar1) {
    uVar2 = NaPetriNode::activations(&this->super_NaPetriNode);
    iVar3 = (*this->pDataF->_vptr_NaDataFile[(ulong)(uVar2 == 0) + 4])();
    return SUB41(iVar3,0);
  }
  return false;
}

Assistant:

bool
NaPNFileInput::activate ()
{
    // Check data is read by data destination connectors
    if(!NaPetriNode::activate())
        // Data must be stored until all destination connectors
        // would read them
        return false;

    // Return 'true' if there are data for reading or 'false' otherwise
    if(0 == activations())
        return pDataF->GoStartRecord();
    return pDataF->GoNextRecord();
}